

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

void CP_TimestepMetadataHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  SstStream in_RCX;
  SstStream in_RDX;
  undefined8 in_RDI;
  _TimestepMetadataMsg *in_R8;
  _TimestepMetadataMsg *Msg;
  SstStream Stream;
  char *tmpstr;
  TSMetadataMsg in_stack_ffffffffffffffb8;
  SstStream s;
  SstStream in_stack_ffffffffffffffd0;
  
  if (_perfstubs_initialized == 1) {
    if (CP_TimestepMetadataHandler::timer == (void *)0x0) {
      in_stack_ffffffffffffffd0 =
           (SstStream)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_reader.c"
                               ,"CP_TimestepMetadataHandler",0x3b2);
      CP_TimestepMetadataHandler::timer = (void *)ps_timer_create_(in_stack_ffffffffffffffd0);
      free(in_stack_ffffffffffffffd0);
    }
    ps_timer_start_(CP_TimestepMetadataHandler::timer);
  }
  s = (SstStream)in_RDX->CPInfo;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  if ((s->Rank == 0) && (s->WriterConfigParams->CPCommPattern != 1)) {
    CMtake_buffer(in_RDI,in_RDX);
    queueTimestepMetadataMsgAndNotify(in_RCX,in_R8,(CMConnection)in_stack_ffffffffffffffd0);
  }
  else {
    if (*(long *)&in_RDX->DPVerbosityLevel == 0) {
      CP_verbose(s,PerRankVerbose,"Received a message that timestep %ld has been discarded\n",
                 in_RDX->mpiComm);
      if (s->WriterConfigParams->MarshalMethod == 0) {
        FFSMarshalInstallPreciousMetadata(in_RDX,in_stack_ffffffffffffffb8);
      }
      else if (s->WriterConfigParams->MarshalMethod == 2) {
        AddFormatsToMetaMetaInfo(in_stack_ffffffffffffffd0,(_TimestepMetadataMsg *)s);
        AddAttributesToAttrDataList(in_stack_ffffffffffffffd0,(_TimestepMetadataMsg *)s);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
      return;
    }
    CP_verbose(s,PerStepVerbose,"Received an incoming metadata message for timestep %ld\n",
               in_RDX->mpiComm);
    CMtake_buffer(in_RDI,in_RDX);
    queueTimestepMetadataMsgAndNotify(in_RCX,in_R8,(CMConnection)in_stack_ffffffffffffffd0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(CP_TimestepMetadataHandler::timer);
  }
  return;
}

Assistant:

void CP_TimestepMetadataHandler(CManager cm, CMConnection conn, void *Msg_v, void *client_data,
                                attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    SstStream Stream;
    struct _TimestepMetadataMsg *Msg = (struct _TimestepMetadataMsg *)Msg_v;
    Stream = (SstStream)Msg->RS_Stream;
    STREAM_MUTEX_LOCK(Stream);
    if ((Stream->Rank != 0) || (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer))
    {
        /* All ranks are getting this */
        if (Msg->Metadata == NULL)
        {
            CP_verbose(Stream, PerRankVerbose,
                       "Received a message that timestep %ld has been discarded\n", Msg->Timestep);

            /*
             * before discarding, install any precious metadata from this
             * message
             */
            if (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS)
            {
                FFSMarshalInstallPreciousMetadata(Stream, Msg);
            }
            else if (Stream->WriterConfigParams->MarshalMethod == SstMarshalBP5)
            {
                AddFormatsToMetaMetaInfo(Stream, Msg);
                AddAttributesToAttrDataList(Stream, Msg);
            }
            STREAM_MUTEX_UNLOCK(Stream);

            return;
        }
        else
        {
            CP_verbose(Stream, PerStepVerbose,
                       "Received an incoming metadata message for timestep %ld\n", Msg->Timestep);
        }
        /* arrange for this message data to stay around */
        CMtake_buffer(cm, Msg);

        queueTimestepMetadataMsgAndNotify(Stream, Msg, conn);
    }
    else
    {
        /* I must be rank 0 and only I got this, I'll need to distribute it to
         * everyone */
        /* arrange for this message data to stay around */
        CMtake_buffer(cm, Msg);

        queueTimestepMetadataMsgAndNotify(Stream, Msg, conn);
    }
    STREAM_MUTEX_UNLOCK(Stream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}